

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManSerializer.cpp
# Opt level: O2

int __thiscall
adios2::format::DataManSerializer::GetData<std::__cxx11::string>
          (DataManSerializer *this,string *outputData,string *varName,Dims *varStart,Dims *varCount,
          size_t step,MemorySpace varMemSpace,Dims *varMemStart,Dims *varMemCount)

{
  mutex *__mutex;
  pointer pDVar1;
  element_type *peVar2;
  __type _Var3;
  int iVar4;
  iterator iVar5;
  undefined8 uVar6;
  pointer pcVar7;
  DataManVar *j;
  pointer pDVar8;
  ScopedTimer __var2677;
  DmvVecPtr vec;
  size_t step_local;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  step_local = step;
  if ((GetData<std::__cxx11::string>(std::__cxx11::string*,std::__cxx11::string_const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long,adios2::MemorySpace,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
       ::__var677 == '\0') &&
     (iVar4 = __cxa_guard_acquire(&GetData<std::__cxx11::string>(std::__cxx11::string*,std::__cxx11::string_const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long,adios2::MemorySpace,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                                   ::__var677), iVar4 != 0)) {
    uVar6 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/dataman/DataManSerializer.cpp"
                                ,
                                "int adios2::format::DataManSerializer::GetData(std::string *, const std::string &, const Dims &, const Dims &, const size_t, const MemorySpace, const Dims &, const Dims &)"
                                ,0x2a5);
    GetData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    __var677 = (void *)ps_timer_create_(uVar6);
    __cxa_guard_release(&GetData<std::__cxx11::string>(std::__cxx11::string*,std::__cxx11::string_const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long,adios2::MemorySpace,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                         ::__var677);
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            (&__var2677,
             GetData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::__var677);
  vec.
  super___shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  vec.
  super___shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __mutex = &this->m_DataManVarMapMutex;
  std::mutex::lock(__mutex);
  iVar5 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->m_DataManVarMap)._M_h,&step_local);
  if (iVar5.
      super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    iVar4 = -1;
  }
  else {
    std::
    __shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>,_(__gnu_cxx::_Lock_policy)2>
    ::operator=(&vec.
                 super___shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>,_(__gnu_cxx::_Lock_policy)2>
                ,(__shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)((long)iVar5.
                           super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>,_false>
                           ._M_cur + 0x10));
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if (vec.
        super___shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) {
      iVar4 = -2;
    }
    else {
      pDVar1 = ((vec.
                 super___shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->
               super__Vector_base<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pDVar8 = ((vec.
                      super___shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->
                    super__Vector_base<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>
                    )._M_impl.super__Vector_impl_data._M_start; pDVar8 != pDVar1;
          pDVar8 = pDVar8 + 1) {
        _Var3 = std::operator==(&pDVar8->name,varName);
        if ((_Var3) &&
           (peVar2 = (pDVar8->buffer).
                     super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr, peVar2 != (element_type *)0x0)) {
          pcVar7 = (peVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start + pDVar8->position;
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_50,pcVar7,pcVar7 + pDVar8->size);
          std::__cxx11::string::operator=((string *)outputData,(string *)local_50);
          std::__cxx11::string::~string((string *)local_50);
        }
      }
      iVar4 = 0;
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&vec.
              super___shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var2677);
  return iVar4;
}

Assistant:

int DataManSerializer::GetData(std::string *outputData, const std::string &varName,
                               const Dims &varStart, const Dims &varCount, const size_t step,
                               const MemorySpace varMemSpace, const Dims &varMemStart,
                               const Dims &varMemCount)
{
    PERFSTUBS_SCOPED_TIMER_FUNC();

    DmvVecPtr vec = nullptr;

    {
        std::lock_guard<std::mutex> l(m_DataManVarMapMutex);
        const auto &i = m_DataManVarMap.find(step);
        if (i == m_DataManVarMap.end())
        {
            return -1; // step not found
        }
        else
        {
            vec = i->second;
        }
    }

    if (vec == nullptr)
    {
        return -2; // step found but variable not found
    }

    char *input_data = nullptr;

    for (const auto &j : *vec)
    {
        if (j.name == varName)
        {
            if (j.buffer == nullptr)
            {
                continue;
            }
            else
            {
                input_data = reinterpret_cast<char *>(j.buffer->data());
            }

            input_data += j.position;

            *outputData = std::string(input_data, j.size);
        }
    }
    return 0;
}